

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.hpp
# Opt level: O0

void __thiscall
so_5::disp::reuse::work_thread::demand_queue_details::no_activity_tracking_impl_t::
no_activity_tracking_impl_t(no_activity_tracking_impl_t *this,lock_unique_ptr_t *lock)

{
  unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  local_20;
  lock_unique_ptr_t *local_18;
  lock_unique_ptr_t *lock_local;
  no_activity_tracking_impl_t *this_local;
  
  local_18 = lock;
  lock_local = (lock_unique_ptr_t *)this;
  std::
  unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  ::unique_ptr(&local_20,lock);
  common_data_t::common_data_t(&this->super_common_data_t,&local_20);
  std::
  unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
  ::~unique_ptr(&local_20);
  return;
}

Assistant:

no_activity_tracking_impl_t(
		queue_traits::lock_unique_ptr_t lock )
		:	common_data_t( std::move(lock) )
	{}